

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkYddNorm(ARKodeMem ark_mem,realtype hg,realtype *yddnrm)

{
  int iVar1;
  N_Vector in_RSI;
  ARKodeMem in_RDI;
  N_Vector in_XMM0_Qa;
  void *pvVar2;
  int retval;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  if (in_RDI->interp == (ARKInterp)0x0) {
    arkProcessError(in_RDI,-0x15,"ARKode","arkYddNorm","Missing interpolation structure");
    local_4 = -0x15;
  }
  else {
    N_VLinearSum((realtype)in_RDI,in_XMM0_Qa,(realtype)in_RSI,
                 (N_Vector)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (N_Vector)0xec50bd);
    iVar1 = (*in_RDI->step_fullrhs)
                      (in_RDI,in_RDI->tcur + (double)in_XMM0_Qa,in_RDI->ycur,in_RDI->tempv1,2);
    if (iVar1 == 0) {
      N_VLinearSum((realtype)in_RDI,in_XMM0_Qa,(realtype)in_RSI,
                   (N_Vector)(ulong)in_stack_ffffffffffffffd8,(N_Vector)0xec515d);
      N_VScale((realtype)in_RSI,(N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
               (N_Vector)0xec5182);
      pvVar2 = (void *)N_VWrmsNorm(in_RSI,(N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
      in_RSI->content = pvVar2;
      local_4 = 0;
    }
    else {
      local_4 = -8;
    }
  }
  return local_4;
}

Assistant:

int arkYddNorm(ARKodeMem ark_mem, realtype hg, realtype *yddnrm)
{
  int retval;

  if (ark_mem->interp == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode", "arkYddNorm",
                    "Missing interpolation structure");
    return(ARK_MEM_NULL);
  }

  /* increment y with a multiple of f */
  N_VLinearSum(hg, ark_mem->fn, ONE, ark_mem->yn, ark_mem->ycur);

  /* compute y', via the ODE RHS routine */
  retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tcur + hg, ark_mem->ycur,
                                 ark_mem->tempv1, ARK_FULLRHS_OTHER);
  if (retval != 0) return(ARK_RHSFUNC_FAIL);

  /* difference new f and original f to estimate y'' */
  N_VLinearSum(ONE/hg, ark_mem->tempv1, -ONE/hg, ark_mem->fn, ark_mem->tempv1);

  /* reset ycur to equal yn (unnecessary?) */
  N_VScale(ONE, ark_mem->yn, ark_mem->ycur);

  /* compute norm of y'' */
  *yddnrm = N_VWrmsNorm(ark_mem->tempv1, ark_mem->ewt);

  return(ARK_SUCCESS);
}